

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TestCase * __thiscall Catch::TestCase::operator=(TestCase *this,TestCase *other)

{
  TestCase temp;
  TestCase TStack_128;
  
  TestCase(&TStack_128,other);
  swap(this,&TStack_128);
  ~TestCase(&TStack_128);
  return this;
}

Assistant:

TestCase& TestCase::operator = ( TestCase const& other ) {
        TestCase temp( other );
        swap( temp );
        return *this;
    }